

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  deUint32 dVar1;
  FramebufferType width;
  bool bVar2;
  GLenum GVar3;
  deBool dVar4;
  deInt32 dVar5;
  int iVar6;
  int iVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  reference data;
  RenderTarget *pRVar10;
  PixelFormat *pPVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *src;
  ConstPixelBufferAccess *pCVar13;
  ConstPixelBufferAccess *result;
  Enum<int,_2UL> EVar14;
  FramebufferType local_a7c;
  Vector<float,_4> local_984;
  float local_974;
  float local_970;
  float alphaThreshold_1;
  float blueThreshold_1;
  float greenThreshold_1;
  float redThreshold_1;
  IVec4 formatBitDepths_1;
  undefined1 local_948 [8];
  Texture2D resultRGBA8;
  undefined1 local_8f0 [8];
  Texture2D referenceRGBA8;
  undefined1 local_898 [4];
  deUint8 alphaThreshold;
  deUint8 blueThreshold;
  deUint8 greenThreshold;
  deUint8 redThreshold;
  IVec4 formatBitDepths;
  ConstPixelBufferAccess resultAccess;
  int rowPitch;
  int rowWidth;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  MessageBuilder local_6c0;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  undefined1 local_240 [8];
  Texture2D reference;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  int local_1c;
  int pixelSize;
  TextureFormat format;
  ReadPixelsTest_conflict *this_local;
  
  format = (TextureFormat)this;
  tcu::TextureFormat::TextureFormat((TextureFormat *)&stack0xffffffffffffffe8,RGBA,UNORM_INT8);
  getFormatInfo(this,(TextureFormat *)&stack0xffffffffffffffe8,&local_1c);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [9])"Format: ");
  EVar14 = glu::getTextureFormatStr(*(int *)&this->m_program);
  local_1d0 = EVar14.m_getName;
  local_1c8 = EVar14.m_value;
  local_1c0[0].m_getName = local_1d0;
  local_1c0[0].m_value = local_1c8;
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_1c0);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])", Type: ");
  EVar14 = glu::getTypeStr(*(int *)((long)&this->m_program + 4));
  reference.m_view.m_levels = (ConstPixelBufferAccess *)EVar14.m_getName;
  local_1e0.m_value = EVar14.m_value;
  local_1e0.m_getName = (GetNameFunc)reference.m_view.m_levels;
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1e0);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_240,(TextureFormat *)&stack0xffffffffffffffe8,this->m_framebuffeType
             ,this->m_renderbufferFormat);
  tcu::Texture2D::allocLevel((Texture2D *)local_240,0);
  do {
    glwPixelStorei(0xd05,(this->m_random).m_rnd.z);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x152);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3c0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [20])"GL_PACK_ALIGNMENT: ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&(this->m_random).m_rnd.z);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  do {
    glwPixelStorei(0xd02,(this->m_random).m_rnd.w);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glPixelStorei(GL_PACK_ROW_LENGTH, m_rowLength)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x155);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_540,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [21])"GL_PACK_ROW_LENGTH: ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&(this->m_random).m_rnd.w);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_540);
  do {
    glwPixelStorei(0xd03,*(GLint *)&this->m_log);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glPixelStorei(GL_PACK_SKIP_ROWS, m_skipRows)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x158);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_6c0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_6c0,(char (*) [20])"GL_PACK_SKIP_ROWS: ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&this->m_log);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6c0);
  do {
    glwPixelStorei(0xd04,*(GLint *)((long)&this->m_log + 4));
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glPixelStorei(GL_PACK_SKIP_PIXELS, m_skipPixels)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x15b);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pTVar8,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      &pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [22])"GL_PACK_SKIP_PIXELS: ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)((long)&this->m_log + 4));
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    glwViewport(0,0,this->m_framebuffeType,this->m_renderbufferFormat);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glViewport(0, 0, m_width, m_height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x15e);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rowPitch);
  clearColor(this,(Texture2D *)local_240,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rowPitch,local_1c);
  if ((this->m_random).m_rnd.w == 0) {
    local_a7c = this->m_framebuffeType;
  }
  else {
    local_a7c = (this->m_random).m_rnd.w;
  }
  dVar1 = (this->m_random).m_rnd.z;
  dVar5 = deCeilFloatToInt32((float)(int)(local_1c * local_a7c) / (float)(int)dVar1);
  iVar6 = dVar1 * dVar5;
  width = this->m_framebuffeType;
  GVar3 = this->m_renderbufferFormat;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rowPitch,
                    (long)(local_1c * *(int *)((long)&this->m_log + 4) +
                          *(int *)&this->m_log * iVar6));
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)(formatBitDepths.m_data + 2),
             (TextureFormat *)&stack0xffffffffffffffe8,width,GVar3,1,iVar6,0,data);
  if (((this->m_random).m_rnd.y & 0x100) == 0) {
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = tcu::RenderTarget::getNumSamples(pRVar10);
    if (1 < iVar6) {
      tcu::getTextureFormatBitDepth((tcu *)local_898,(TextureFormat *)&stack0xffffffffffffffe8);
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
      iVar6 = pPVar11->redBits;
      iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_898);
      iVar6 = ::deMin32(iVar6,iVar7);
      dVar5 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar6 & 0x1f))) * 256.0);
      referenceRGBA8.m_view.m_levels._7_1_ = (byte)dVar5;
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
      iVar6 = pPVar11->greenBits;
      iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_898);
      iVar6 = ::deMin32(iVar6,iVar7);
      dVar5 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar6 & 0x1f))) * 256.0);
      referenceRGBA8.m_view.m_levels._6_1_ = (byte)dVar5;
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
      iVar6 = pPVar11->blueBits;
      iVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_898);
      iVar6 = ::deMin32(iVar6,iVar7);
      dVar5 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar6 & 0x1f))) * 256.0);
      referenceRGBA8.m_view.m_levels._5_1_ = (byte)dVar5;
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
      iVar6 = pPVar11->alphaBits;
      iVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_898);
      iVar6 = ::deMin32(iVar6,iVar7);
      dVar5 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar6 & 0x1f))) * 256.0);
      referenceRGBA8.m_view.m_levels._4_1_ = (byte)dVar5;
      tcu::TextureFormat::TextureFormat
                ((TextureFormat *)&resultRGBA8.m_view.m_levels,RGBA,UNORM_INT8);
      tcu::Texture2D::Texture2D
                ((Texture2D *)local_8f0,(TextureFormat *)&resultRGBA8.m_view.m_levels,
                 this->m_framebuffeType,this->m_renderbufferFormat);
      tcu::TextureFormat::TextureFormat
                ((TextureFormat *)(formatBitDepths_1.m_data + 3),RGBA,UNORM_INT8);
      tcu::Texture2D::Texture2D
                ((Texture2D *)local_948,(TextureFormat *)(formatBitDepths_1.m_data + 3),
                 this->m_framebuffeType,this->m_renderbufferFormat);
      tcu::Texture2D::allocLevel((Texture2D *)local_8f0,0);
      tcu::Texture2D::allocLevel((Texture2D *)local_948,0);
      pEVar12 = (EVP_PKEY_CTX *)
                tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_8f0,0);
      src = (EVP_PKEY_CTX *)tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_240,0);
      tcu::copy(pEVar12,src);
      pEVar12 = (EVP_PKEY_CTX *)
                tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_948,0);
      tcu::copy(pEVar12,(EVP_PKEY_CTX *)(formatBitDepths.m_data + 2));
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pCVar13 = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_8f0,0)->
                 super_ConstPixelBufferAccess;
      result = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_948,0)->
                super_ConstPixelBufferAccess;
      tcu::RGBA::RGBA((RGBA *)(formatBitDepths_1.m_data + 2),
                      (uint)referenceRGBA8.m_view.m_levels._7_1_,
                      (uint)referenceRGBA8.m_view.m_levels._6_1_,
                      (uint)referenceRGBA8.m_view.m_levels._5_1_,
                      (uint)referenceRGBA8.m_view.m_levels._4_1_);
      bVar2 = tcu::bilinearCompare
                        (pTVar8,"Result","Result",pCVar13,result,(RGBA)formatBitDepths_1.m_data[2],
                         COMPARE_LOG_RESULT);
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      tcu::Texture2D::~Texture2D((Texture2D *)local_948);
      tcu::Texture2D::~Texture2D((Texture2D *)local_8f0);
      goto LAB_00a73887;
    }
  }
  tcu::getTextureFormatBitDepth((tcu *)&greenThreshold_1,(TextureFormat *)&stack0xffffffffffffffe8);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
  iVar6 = pPVar11->redBits;
  iVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&greenThreshold_1);
  iVar6 = ::deMin32(iVar6,iVar7);
  blueThreshold_1 = 2.0 / (float)(1 << ((byte)iVar6 & 0x1f));
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
  iVar6 = pPVar11->greenBits;
  iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&greenThreshold_1);
  iVar6 = ::deMin32(iVar6,iVar7);
  alphaThreshold_1 = 2.0 / (float)(1 << ((byte)iVar6 & 0x1f));
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
  iVar6 = pPVar11->blueBits;
  iVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&greenThreshold_1);
  iVar6 = ::deMin32(iVar6,iVar7);
  local_970 = 2.0 / (float)(1 << ((byte)iVar6 & 0x1f));
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
  iVar6 = pPVar11->alphaBits;
  iVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&greenThreshold_1);
  iVar6 = ::deMin32(iVar6,iVar7);
  local_974 = 2.0 / (float)(1 << ((byte)iVar6 & 0x1f));
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pCVar13 = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_240,0)->
             super_ConstPixelBufferAccess;
  tcu::Vector<float,_4>::Vector(&local_984,blueThreshold_1,alphaThreshold_1,local_970,local_974);
  bVar2 = tcu::floatThresholdCompare
                    (pTVar8,"Result","Result",pCVar13,
                     (ConstPixelBufferAccess *)(formatBitDepths.m_data + 2),&local_984,
                     COMPARE_LOG_RESULT);
  if (bVar2) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
LAB_00a73887:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rowPitch);
  tcu::Texture2D::~Texture2D((Texture2D *)local_240);
  return STOP;
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate(void)
{
	int width				= m_context.getRenderTarget().getWidth();
	int height				= m_context.getRenderTarget().getHeight();

	GLuint framebuffer	= 0;
	GLuint renderbuffer	= 0;

	switch (m_framebuffeType)
	{
		case TestSpec::FRAMEBUFFERTYPE_NATIVE:
			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			break;

		case TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER:
		{
			GLU_CHECK_CALL(glGenFramebuffers(1, &framebuffer));
			GLU_CHECK_CALL(glGenRenderbuffers(1, &renderbuffer));

			GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer));
			GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, m_renderbufferFormat, width, height));

			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer));

			break;
		}

		default:
			DE_ASSERT(false);
	}

	clearColor(m_colorScale * 0.4f, m_colorScale * 1.0f, m_colorScale * 0.5f, m_colorScale * 1.0f);

	if (m_useColorClears)
	{
		const int maxClearCount	= 10;
		const int minClearCount	= 6;
		const int minClearSize	= 15;

		int clearCount = m_random.getInt(minClearCount, maxClearCount);

		for (int clearNdx = 0; clearNdx < clearCount; clearNdx++)
		{
			int clearX = m_random.getInt(0, width - minClearSize);
			int clearY = m_random.getInt(0, height - minClearSize);

			int clearWidth = m_random.getInt(minClearSize, width - clearX);
			int clearHeight = m_random.getInt(minClearSize, height - clearY);

			float clearRed		= m_colorScale * m_random.getFloat();
			float clearGreen	= m_colorScale * m_random.getFloat();
			float clearBlue		= m_colorScale * m_random.getFloat();
			float clearAlpha	= m_colorScale * (0.5f + 0.5f * m_random.getFloat());

			GLU_CHECK_CALL(glEnable(GL_SCISSOR_TEST));
			GLU_CHECK_CALL(glScissor(clearX, clearY, clearWidth, clearHeight));

			clearColor(clearRed, clearGreen, clearBlue, clearAlpha);
		}

		GLU_CHECK_CALL(glDisable(GL_SCISSOR_TEST));
	}

	if (m_renderTriangles)
	{
		const int minTriangleCount = 4;
		const int maxTriangleCount = 10;

		int triangleCount = m_random.getInt(minTriangleCount, maxTriangleCount);

		for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
		{
			float x1 = 2.0f * m_random.getFloat() - 1.0f;
			float y1 = 2.0f * m_random.getFloat() - 1.0f;
			float z1 = 2.0f * m_random.getFloat() - 1.0f;

			float x2 = 2.0f * m_random.getFloat() - 1.0f;
			float y2 = 2.0f * m_random.getFloat() - 1.0f;
			float z2 = 2.0f * m_random.getFloat() - 1.0f;

			float x3 = 2.0f * m_random.getFloat() - 1.0f;
			float y3 = 2.0f * m_random.getFloat() - 1.0f;
			float z3 = 2.0f * m_random.getFloat() - 1.0f;

			renderTriangle(tcu::Vec3(x1, y1, z1), tcu::Vec3(x2, y2, z2), tcu::Vec3(x3, y3, z3));
		}
	}

	tcu::TextureFormat	readFormat;
	GLenum				readPixelsFormat;
	GLenum				readPixelsType;
	bool				floatCompare;


	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_UNSIGNED_BYTE;
		floatCompare		= false;
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_UNSIGNED_BYTE;
				floatCompare		= true;
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_UNSIGNED_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_UNSIGNED_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
				break;

			default:
				DE_ASSERT(false);
				// Silence warnings
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
		}
	}
	else
	{
		// Silence warnings
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_FLOAT;
		floatCompare		= true;
		DE_ASSERT(false);
	}

	tcu::Texture2D	readRefrence	(readFormat, width, height);
	const int		readDataSize	= readRefrence.getWidth() * readRefrence.getHeight() * readFormat.getPixelSize();

	readRefrence.allocLevel(0);

	GLuint pixelBuffer = (GLuint)-1;

	GLU_CHECK_CALL(glGenBuffers(1, &pixelBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glBufferData(GL_PIXEL_PACK_BUFFER, readDataSize, NULL, GL_STREAM_READ));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, 0));

	const deUint8* bufferData = (const deUint8*)glMapBufferRange(GL_PIXEL_PACK_BUFFER, 0, readDataSize, GL_MAP_READ_BIT);
	GLU_CHECK_MSG("glMapBufferRange() failed");

	tcu::ConstPixelBufferAccess readResult(readFormat, width, height, 1, bufferData);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, 0));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, readRefrence.getLevel(0).getDataPtr()));

	if (framebuffer)
		GLU_CHECK_CALL(glDeleteFramebuffers(1, &framebuffer));

	if (renderbuffer)
		GLU_CHECK_CALL(glDeleteRenderbuffers(1, &renderbuffer));


	bool isOk = false;

	if (floatCompare)
		isOk = tcu::floatThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::COMPARE_LOG_RESULT);
	else
		isOk = tcu::intThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glUnmapBuffer(GL_PIXEL_PACK_BUFFER));
	GLU_CHECK_CALL(glDeleteBuffers(1, &pixelBuffer));

	if (isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
}